

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts_parallel.hpp
# Opt level: O0

void mcts::MCTS_parallel_<ttt::Board,mcts::RandomPlayout<ttt::Board>>
               (MCTSPNode *root,Board *root_game)

{
  initializer_list<mcts::MCTSPNode_*> __l;
  IPlayer IVar1;
  bool bVar2;
  int iVar3;
  reference ppMVar4;
  ulong uVar5;
  size_type sVar6;
  reference ppMVar7;
  MCTSPNode *pMVar8;
  Board *in_RSI;
  MCTSPNode *in_RDI;
  double dVar9;
  __type _Var10;
  uint i_1;
  int p_2;
  int status_1;
  Board new_game;
  MCTSPNode *new_node;
  long m;
  iterator __end0;
  iterator __begin0;
  vector<long,_std::allocator<long>_> *__range2;
  vector<long,_std::allocator<long>_> moves;
  uint i;
  int p_1;
  int status;
  double p;
  MCTSPNode *n;
  iterator __end3;
  iterator __begin3;
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *__range3;
  IMove move;
  double min;
  MCTSPNode *child;
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> nodes;
  int player;
  Board game;
  MCTSPNode *node;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe98;
  MCTSPNode *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  Board *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffec8;
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *this;
  undefined4 in_stack_fffffffffffffed8;
  uint uVar11;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar12;
  Board *game_00;
  undefined2 uVar13;
  undefined6 in_stack_fffffffffffffef2;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_f0;
  undefined1 *local_e8;
  undefined1 local_e0 [24];
  undefined4 local_c8;
  uint local_c4;
  int local_c0;
  int local_bc;
  double local_b8;
  MCTSPNode *local_b0;
  MCTSPNode **local_a8;
  __normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
  local_a0;
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *local_98;
  IMove local_90;
  double local_88;
  MCTSPNode *local_80;
  undefined1 local_61 [25];
  vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> local_48;
  int local_2c;
  Board *local_28;
  undefined2 local_20;
  MCTSPNode *local_18;
  MCTSPNode *local_8;
  
  local_20 = *(undefined2 *)((in_RSI->board)._M_elems[2]._M_elems + 2);
  local_28 = *(Board **)(in_RSI->board)._M_elems;
  local_18 = in_RDI;
  local_8 = in_RDI;
  IVar1 = ttt::Board::GetPlayerToMove(in_RSI);
  local_2c = 3 - IVar1;
  local_61._1_8_ = local_8;
  local_61._9_8_ = local_61 + 1;
  local_61._17_8_ = 1;
  this = (vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)local_61;
  std::allocator<mcts::MCTSPNode_*>::allocator((allocator<mcts::MCTSPNode_*> *)0x1ef982);
  __l._M_array._4_4_ = in_stack_fffffffffffffedc;
  __l._M_array._0_4_ = in_stack_fffffffffffffed8;
  __l._M_len._0_4_ = in_stack_fffffffffffffee0;
  __l._M_len._4_4_ = in_stack_fffffffffffffee4;
  std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::vector
            (this,__l,in_stack_fffffffffffffec8);
  std::allocator<mcts::MCTSPNode_*>::~allocator((allocator<mcts::MCTSPNode_*> *)0x1ef9b3);
  while (bVar2 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::empty
                           ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                            in_stack_fffffffffffffeb0), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_80 = (MCTSPNode *)0x0;
    local_88 = 0.0;
    local_90 = -1;
    local_98 = &local_18->children;
    local_a0._M_current =
         (MCTSPNode **)
         std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::begin
                   ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                    in_stack_fffffffffffffe98);
    local_a8 = (MCTSPNode **)
               std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::end
                         ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                          in_stack_fffffffffffffe98);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
                               *)in_stack_fffffffffffffe98), bVar2) {
      ppMVar4 = __gnu_cxx::
                __normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
                ::operator*(&local_a0);
      local_b0 = *ppMVar4;
      dVar9 = local_b0->value / (double)local_b0->total;
      _Var10 = std::log<long_long>(0x1efa9d);
      local_b8 = sqrt((_Var10 * 2.0) / (double)local_b0->total);
      local_b8 = dVar9 + local_b8;
      if ((local_88 < local_b8) || (local_80 == (MCTSPNode *)0x0)) {
        local_90 = local_b0->move;
        local_80 = local_b0;
        local_88 = local_b8;
      }
      __gnu_cxx::
      __normal_iterator<mcts::MCTSPNode_**,_std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>_>
      ::operator++(&local_a0);
    }
    local_18 = local_80;
    std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::push_back
              ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
               in_stack_fffffffffffffeb0,
               (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    ttt::Board::ApplyMove
              (in_stack_fffffffffffffeb0,
               (IMove *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  }
  local_bc = ttt::Board::GetStatus((Board *)0x1efbd2);
  if (local_bc == -1) {
    ttt::Board::GetPossibleMoves
              ((Board *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_e8 = local_e0;
    local_f0._M_current =
         (long *)std::vector<long,_std::allocator<long>_>::begin(in_stack_fffffffffffffe98);
    std::vector<long,_std::allocator<long>_>::end(in_stack_fffffffffffffe98);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffea0,
                              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)in_stack_fffffffffffffe98), bVar2) {
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator*
                (&local_f0);
      in_stack_fffffffffffffeb0 = (Board *)operator_new(0x30);
      MCTSPNode::MCTSPNode(in_stack_fffffffffffffea0,(IMove)in_stack_fffffffffffffe98);
      game_00 = local_28;
      uVar13 = local_20;
      ttt::Board::ApplyMove
                (in_stack_fffffffffffffeb0,
                 (IMove *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::push_back
                ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                 in_stack_fffffffffffffeb0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::push_back
                ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
                 in_stack_fffffffffffffeb0,
                 (value_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffeac =
           RandomPlayout<ttt::Board>::operator()
                     ((RandomPlayout<ttt::Board> *)CONCAT62(in_stack_fffffffffffffef2,uVar13),
                      game_00);
      uVar11 = 0;
      iVar3 = local_2c;
      iVar12 = in_stack_fffffffffffffeac;
      while( true ) {
        in_stack_fffffffffffffea0 = (MCTSPNode *)(ulong)uVar11;
        pMVar8 = (MCTSPNode *)
                 std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::size(&local_48)
        ;
        if (pMVar8 <= in_stack_fffffffffffffea0) break;
        ppMVar7 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                            (&local_48,(ulong)uVar11);
        (*ppMVar7)->total = (*ppMVar7)->total + 1;
        if (iVar3 == iVar12) {
          ppMVar7 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                              (&local_48,(ulong)uVar11);
          (*ppMVar7)->value = (*ppMVar7)->value + 1.0;
        }
        else if (iVar12 == 0) {
          ppMVar7 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                              (&local_48,(ulong)uVar11);
          (*ppMVar7)->value = (*ppMVar7)->value + 0.5;
        }
        uVar11 = uVar11 + 1;
        iVar3 = 3 - iVar3;
      }
      std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::pop_back
                ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)0x1eff46);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&local_f0);
    }
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
    local_c8 = 0;
  }
  else {
    local_c0 = local_2c;
    for (local_c4 = 0; uVar5 = (ulong)local_c4,
        sVar6 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::size(&local_48),
        uVar5 < sVar6; local_c4 = local_c4 + 1) {
      ppMVar7 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                          (&local_48,(ulong)local_c4);
      (*ppMVar7)->total = (*ppMVar7)->total + 1;
      if (local_c0 == local_bc) {
        ppMVar7 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                            (&local_48,(ulong)local_c4);
        (*ppMVar7)->value = (*ppMVar7)->value + 1.0;
      }
      else if (local_bc == 0) {
        ppMVar7 = std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::operator[]
                            (&local_48,(ulong)local_c4);
        (*ppMVar7)->value = (*ppMVar7)->value + 0.5;
      }
      local_c0 = 3 - local_c0;
    }
    local_c8 = 1;
  }
  std::vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_>::~vector
            ((vector<mcts::MCTSPNode_*,_std::allocator<mcts::MCTSPNode_*>_> *)
             in_stack_fffffffffffffeb0);
  return;
}

Assistant:

static void
MCTS_parallel_(MCTSPNode *root, const IGame &root_game)
{
    auto node = root;
    auto game = root_game;
    auto player = 3 - root_game.GetPlayerToMove();
    std::vector<MCTSPNode *> nodes = {root};
    while (!node->children.empty())
    {
        MCTSPNode *child = nullptr;
        double min = 0.0;
        game::IMove move = -1;
        for (auto n : node->children)
        {
            double p = static_cast<double>(n->value) / n->total + std::sqrt(2.0 * std::log(node->total) / n->total);
            if (p > min || child == nullptr)
            {
                min = p;
                move = n->move;
                child = n;
            }
        }
        node = child;
        nodes.push_back(node);
        game.ApplyMove(move);
    }

    auto status = game.GetStatus();
    if (status != game::Undecided)
    {
        auto p = player;
        for (unsigned i = 0; i < nodes.size(); ++i, p = 3 - p)
        {
            ++nodes[i]->total;
            if (p == status)
                nodes[i]->value += 1.0;
            else if (status == game::Draw)
                nodes[i]->value += 0.5;
        }
        return;
    }

    auto moves = game.GetPossibleMoves();
    for (auto m : moves)
    {
        auto new_node = new MCTSPNode(m);
        auto new_game = game;
        new_game.ApplyMove(m);
        node->children.push_back(new_node);
        nodes.push_back(new_node);
        auto status = RandomPlayout()(new_game);
        auto p = player;
        for (unsigned i = 0; i < nodes.size(); ++i, p = 3 - p)
        {
            ++nodes[i]->total;
            if (p == status)
                nodes[i]->value += 1.0;
            else if (status == game::Draw)
                nodes[i]->value += 0.5;
        }
        nodes.pop_back();
    }
}